

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O2

void __thiscall indigox::Bond::Bond(Bond *this,Atom_p *a,Atom_p *b)

{
  __weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  utils::CountableObject<indigox::Bond>::__id_generator_ =
       utils::CountableObject<indigox::Bond>::__id_generator_ + 1;
  (this->super_CountableObject<indigox::Bond>).id_ =
       utils::CountableObject<indigox::Bond>::__id_generator_;
  (this->super_enable_shared_from_this<indigox::Bond>)._M_weak_this.
  super___weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<indigox::Bond>)._M_weak_this.
  super___weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->atoms_)._M_elems[0].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->atoms_)._M_elems[0].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->atoms_)._M_elems[1].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->atoms_)._M_elems[1].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mol_).super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mol_).super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->order_ = UNDEFINED_BOND;
  std::__weak_ptr<indigox::Atom,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<indigox::Atom,void>
            ((__weak_ptr<indigox::Atom,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             &a->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>);
  std::__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *)&this->atoms_,&local_30);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_30._M_refcount);
  std::__weak_ptr<indigox::Atom,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<indigox::Atom,void>
            ((__weak_ptr<indigox::Atom,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             &b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>);
  std::__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->atoms_)._M_elems[1].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>
             ,&local_30);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_30._M_refcount);
  this->idx_ = (this->super_CountableObject<indigox::Bond>).id_;
  return;
}

Assistant:

Bond::Bond(Atom_p a, Atom_p b) : utils::CountableObject<Bond>(), mol_() {
    atoms_[0] = Atom_wp(a);
    atoms_[1] = Atom_wp(b);
    idx_ = GetUniqueID();
  }